

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O1

bool __thiscall Func::HasArrayInfo(Func *this)

{
  Func *this_00;
  bool bVar1;
  BOOL BVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *pJVar3;
  intptr_t iVar4;
  FunctionJITTimeInfo *this_01;
  
  this_00 = this->topFunc;
  pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  bVar1 = JITTimeFunctionBody::HasProfileInfo(pJVar3);
  if ((((bVar1) && (iVar4 = GetWeakFuncRef(this), iVar4 != 0)) &&
      ((BVar2 = HasTry(this_00), BVar2 == 0 || (bVar1 = DoOptimizeTry(this_00), bVar1)))) &&
     (bVar1 = DoGlobOpt(this_00), bVar1)) {
    pJVar3 = JITTimeWorkItem::GetJITFunctionBody(this_00->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar3);
    this_01 = JITTimeWorkItem::GetJITTimeInfo(this_00->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,LoopFastPathPhase,sourceContextId,functionId);
    return !bVar1;
  }
  return false;
}

Assistant:

bool                HasArrayInfo()
    {
        const auto top = this->GetTopFunc();
        return this->HasProfileInfo() && this->GetWeakFuncRef() && !(top->HasTry() && !top->DoOptimizeTry()) &&
            top->DoGlobOpt() && !PHASE_OFF(Js::LoopFastPathPhase, top);
    }